

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chibicc_tokenize.c
# Opt level: O1

int error_sprintf(C_Parser *parser,char *fmt,...)

{
  char in_AL;
  char extraout_AL;
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  char *pcVar4;
  int iVar5;
  undefined8 in_RCX;
  undefined8 *puVar6;
  undefined8 in_RDX;
  char *fmt_00;
  int iVar7;
  C_Parser *tokenizer;
  undefined8 in_R8;
  undefined8 in_R9;
  uint uVar8;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 extraout_XMM1_Qa;
  undefined8 uVar9;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  __va_list_tag _Stack_1e0;
  undefined1 auStack_1c0 [24];
  undefined1 *puStack_1a8;
  undefined8 uStack_1a0;
  undefined8 uStack_198;
  undefined8 uStack_180;
  undefined8 uStack_170;
  undefined8 uStack_160;
  undefined8 uStack_150;
  undefined8 uStack_140;
  undefined8 uStack_130;
  undefined8 uStack_120;
  code *pcStack_110;
  undefined8 local_108;
  void **local_100;
  undefined1 *local_f8;
  undefined1 local_e8 [16];
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_d8 = in_RDX;
  local_d0 = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  if (parser->error_message == (char *)0x0) {
    iVar5 = 0;
  }
  else {
    pcStack_110 = (code *)0x1232e2;
    sVar2 = strlen(parser->error_message);
    iVar5 = (int)sVar2;
  }
  uVar8 = 0x80;
  iVar7 = 1;
  do {
    pcStack_110 = (code *)0x123312;
    pcVar3 = (char *)(*parser->memory_allocator->realloc)
                               (parser->memory_allocator->arena,parser->error_message,
                                (long)(int)(iVar5 + uVar8));
    parser->error_message = pcVar3;
    local_108 = 0x3000000010;
    local_100 = &args[0].overflow_arg_area;
    local_f8 = local_e8;
    tokenizer = (C_Parser *)(parser->error_message + iVar5);
    pcVar3 = (char *)(ulong)uVar8;
    pcStack_110 = (code *)0x123356;
    puVar6 = &local_108;
    uVar9 = extraout_XMM1_Qa;
    iVar1 = vsnprintf((char *)tokenizer,(size_t)pcVar3,fmt,&local_108);
    if (iVar1 < (int)uVar8) {
      if (-1 < iVar1) {
        return iVar1;
      }
      pcStack_110 = C_error_at;
      error_sprintf_cold_1();
      if (extraout_AL != '\0') {
        uStack_180 = uVar9;
        uStack_170 = in_XMM2_Qa;
        uStack_160 = in_XMM3_Qa;
        uStack_150 = in_XMM4_Qa;
        uStack_140 = in_XMM5_Qa;
        uStack_130 = in_XMM6_Qa;
        uStack_120 = in_XMM7_Qa;
      }
      pcVar4 = tokenizer->current_file->contents;
      iVar5 = 1;
      if (pcVar4 < pcVar3) {
        do {
          iVar5 = iVar5 + (uint)(*pcVar4 == '\n');
          pcVar4 = pcVar4 + 1;
        } while (pcVar4 != pcVar3);
      }
      _Stack_1e0.reg_save_area = auStack_1c0;
      _Stack_1e0.overflow_arg_area = &local_100;
      _Stack_1e0.gp_offset = 0x18;
      _Stack_1e0.fp_offset = 0x30;
      puStack_1a8 = (undefined1 *)puVar6;
      uStack_1a0 = in_R8;
      uStack_198 = in_R9;
      pcStack_110 = (code *)fmt;
      verror_at(tokenizer,tokenizer->current_file->name,tokenizer->current_file->contents,iVar5,
                pcVar3,fmt_00,&_Stack_1e0);
      longjmp((__jmp_buf_tag *)tokenizer->env,1);
    }
    uVar8 = iVar1 + 1;
    iVar7 = iVar7 + -1;
  } while (iVar7 == 0);
  return iVar1;
}

Assistant:

static int error_sprintf(C_Parser *parser, const char *fmt, ...) {
  va_list args;
  int pos = parser->error_message ? (int)strlen(parser->error_message) : 0;
  int estimated_size = 128;
  int n = 0;
  for (int i = 0; i < 2; i++) {
    parser->error_message = parser->memory_allocator->realloc(parser->memory_allocator->arena, parser->error_message, pos + estimated_size); // ensure we have at least estimated_size free space
    va_start(args, fmt);
    n = vsnprintf(parser->error_message + pos, estimated_size, fmt, args);
    va_end(args);
    if (n >= estimated_size) {
      estimated_size = n + 1; // allow for 0 byte
    } else if (n < 0) {
      fprintf(stderr, "Buffer conversion error\n");
      assert(false);
      break;
    } else {
      break;
    }
  }
  return n;
}